

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  ushort uVar1;
  TRef TVar2;
  IRIns *pIVar3;
  bool bVar4;
  IRIns *local_40;
  IRIns *irb_1;
  IRIns *ira;
  IRIns *irs;
  IRRef ref;
  IRIns *irb;
  jit_State *J_local;
  
  if ((J->flags & 0x10000) != 0) {
    if ((J->fold).left[0].field_1.o == 'U') {
      if ((J->fold).left[0].field_0.op2 == 0) {
        TVar2 = lj_ir_kgc(J,(GCobj *)&J[-1].penalty[0x2a].val,IRT_STR);
        return TVar2;
      }
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
      (J->fold).ins.field_0.op2 = (J->fold).left[0].field_0.prev;
      TVar2 = lj_opt_cse(J);
      return TVar2;
    }
    if ((J->fold).left[0].field_1.o == 'V') {
      pIVar3 = (J->cur).ir;
      uVar1 = (J->fold).left[0].field_0.op1;
      if (((&pIVar3->field_1)[uVar1].o == 'U') && ((&pIVar3->field_0)[uVar1].op2 == 0)) {
        return (uint)(J->fold).left[0].field_0.op2;
      }
    }
  }
  if ((J->flags & 0x20000) != 0) {
    uVar1 = J->chain[0x57];
    while (irs._4_4_ = (uint)uVar1, irs._4_4_ != 0) {
      pIVar3 = (J->cur).ir + irs._4_4_;
      irb_1 = (J->fold).left;
      local_40 = (J->cur).ir + (pIVar3->field_0).op1;
      while( true ) {
        bVar4 = false;
        if ((irb_1->field_1).o == (local_40->field_1).o) {
          bVar4 = (irb_1->field_0).op2 == (local_40->field_0).op2;
        }
        if (!bVar4) break;
        if (((irb_1->field_1).o == 'U') && ((irb_1->field_0).op2 == 0)) {
          return irs._4_4_;
        }
        if (((irb_1->field_1).o == 'a') && ((irb_1->field_0).op2 == 0x17)) break;
        irb_1 = (J->cur).ir + (irb_1->field_0).op1;
        local_40 = (J->cur).ir + (local_40->field_0).op1;
      }
      uVar1 = (pIVar3->field_0).prev;
    }
  }
  TVar2 = lj_ir_emit(J);
  return TVar2;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (fleft->op2 == IRBUFHDR_RESET)  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && irb->op2 == IRBUFHDR_RESET)
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && ira->op2 == IRBUFHDR_RESET)
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}